

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imath_3_1::Matrix33<double>_>::readValueFrom
          (TypedAttribute<Imath_3_1::Matrix33<double>_> *this,IStream *is,int size,int version)

{
  IStream *in_RSI;
  long in_RDI;
  double *in_stack_ffffffffffffffa8;
  IStream *v;
  IStream *in_stack_ffffffffffffffb0;
  
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  v = in_RSI;
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),0);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_ffffffffffffffb0,(double *)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(double *)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(double *)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),1);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(double *)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(double *)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(double *)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),2);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RSI,(double *)v);
  return;
}

Assistant:

IMF_EXPORT void
M33dAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value[0][0]);
    Xdr::read<StreamIO> (is, _value[0][1]);
    Xdr::read<StreamIO> (is, _value[0][2]);

    Xdr::read<StreamIO> (is, _value[1][0]);
    Xdr::read<StreamIO> (is, _value[1][1]);
    Xdr::read<StreamIO> (is, _value[1][2]);

    Xdr::read<StreamIO> (is, _value[2][0]);
    Xdr::read<StreamIO> (is, _value[2][1]);
    Xdr::read<StreamIO> (is, _value[2][2]);
}